

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall Logging::Logging(Logging *this)

{
  Clock *pCVar1;
  
  memset(&this->value_populationID,0,0xd8);
  pCVar1 = Clock::getInstance();
  this->clock = pCVar1;
  return;
}

Assistant:

Logging::Logging()
{
    clock = Clock::getInstance();
}